

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
               (uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  ulong uVar247;
  ulong uVar248;
  ulong uVar249;
  ulong uVar250;
  ulong uVar251;
  ulong uVar252;
  ulong uVar253;
  ulong uVar254;
  ulong uVar255;
  ulong uVar256;
  
  uVar249 = arg1[9];
  uVar255 = arg2[9];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar255;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar249;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SUB168(auVar10 * auVar124,0);
  uVar247 = arg2[8];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar247;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar249;
  uVar248 = arg2[7];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar248;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar249;
  uVar250 = arg2[6];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar250;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar249;
  uVar251 = arg2[5];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar251;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar249;
  uVar252 = arg2[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar252;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar249;
  uVar253 = arg2[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar253;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar249;
  uVar254 = arg2[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar254;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar249;
  uVar256 = arg2[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar256;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar249;
  uVar1 = arg1[8];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar255;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar247;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar248;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar1;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar250;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar251;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar252;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar253;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar254;
  uVar2 = arg1[7];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar2;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar255;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar2;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar247;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar2;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar248;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar2;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar250;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar2;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar251;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar2;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar252;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar253;
  uVar3 = arg1[6];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar3;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar255;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar3;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar247;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar3;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar248;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar250;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar3;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SUB168(auVar38 * auVar151,0);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar3;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar251;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar3;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar252;
  uVar4 = arg1[5];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar4;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar255;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar4;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar247;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar4;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar248;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar4;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar250;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar4;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar251;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = SUB168(auVar46 * auVar158,0);
  uVar5 = arg1[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar5;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar255;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar5;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar247;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar5;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar248;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar5;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar250;
  uVar6 = arg1[3];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar6;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar255;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar6;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar247;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar6;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar248;
  uVar7 = arg1[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar7;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar255;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar7;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar247;
  uVar8 = *arg2;
  uVar9 = arg1[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar9;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar255;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar8;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar249;
  uVar249 = uVar256 * 2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar1;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar249;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar8;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar1;
  uVar1 = uVar254 * 2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar2;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar1;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar2;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar249;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar8;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar2;
  uVar2 = uVar253 * 2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar3;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar3;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar3;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar249;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar8;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar3;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar4;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar252;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar4;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar253;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar4;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar254;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar4;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar256;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar8;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar4;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar5;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar251;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar5;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar252;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar5;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar253;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar5;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar254;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar5;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar249;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar8;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar5;
  uVar3 = uVar250 * 2;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar6;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar3;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar6;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar251;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar6;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar252;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar6;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar253;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar6;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar1;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar6;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar249;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar8;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar6;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar7;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar248 * 2;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar7;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar3;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar7;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar251;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar7;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar252;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar7;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar2;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar7;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar7;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar249;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar8;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar7;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar9;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar247 * 2;
  auVar246._8_8_ = SUB168(auVar10 * auVar124,8) * 0x239 + SUB168(auVar11 * ZEXT816(0x239),8);
  auVar246._0_8_ = SUB168(auVar11 * ZEXT816(0x239),0);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar9;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar248 * 2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar9;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar3;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar9;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar251;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar9;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar252 * 2;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar9;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar2;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar9;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar1;
  uVar1 = *arg1;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar9;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar249;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar8;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar9;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar1;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar255;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar1;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar247;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar1;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar248;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar1;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar250;
  auVar244._8_8_ = SUB168(auVar38 * auVar151,8) * 0x472 + SUB168(auVar39 * ZEXT816(0x472),8);
  auVar244._0_8_ = SUB168(auVar39 * ZEXT816(0x472),0);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar1;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar251;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar1;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar252;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar1;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar253;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar1;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar254;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar1;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar256;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar1;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar8;
  auVar227._8_8_ = SUB168(auVar46 * auVar158,8) * 0x239 + SUB168(auVar47 * ZEXT816(0x239),8);
  auVar227._0_8_ = SUB168(auVar47 * ZEXT816(0x239),0);
  auVar10 = auVar51 * auVar162 +
            auVar41 * auVar153 + auVar34 * auVar147 + auVar27 * auVar140 + auVar19 * auVar132 +
            auVar54 * auVar165 + auVar56 * auVar167 + auVar57 * auVar168;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = auVar10._0_8_;
  auVar228._8_8_ = SUB168(auVar113 * ZEXT816(0x472),8) + auVar10._8_8_ * 0x472;
  auVar228._0_8_ = SUB168(auVar113 * ZEXT816(0x472),0);
  auVar228 = auVar112 * auVar223 + auVar227 + auVar228;
  uVar251 = auVar228._0_8_;
  uVar249 = auVar228._8_8_;
  auVar230._8_8_ = uVar249 >> 0x34;
  auVar230._0_8_ = uVar249 * 0x1000 | uVar251 >> 0x34;
  auVar10 = auVar12 * auVar125 + auVar20 * auVar133;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = auVar10._0_8_;
  auVar240._8_8_ = auVar10._8_8_ * 0x239 + SUB168(auVar114 * ZEXT816(0x239),8);
  auVar240._0_8_ = SUB168(auVar114 * ZEXT816(0x239),0);
  auVar10 = auVar28 * auVar141 + auVar21 * auVar134 + auVar13 * auVar126;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = auVar10._0_8_;
  auVar225._8_8_ = SUB168(auVar115 * ZEXT816(0x239),8) + auVar10._8_8_ * 0x239;
  auVar225._0_8_ = SUB168(auVar115 * ZEXT816(0x239),0);
  auVar10 = auVar29 * auVar142 + auVar14 * auVar127 + auVar22 * auVar135 + auVar35 * auVar148;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar10._0_8_;
  auVar237._8_8_ = SUB168(auVar116 * ZEXT816(0x472),8) + auVar10._8_8_ * 0x472;
  auVar237._0_8_ = SUB168(auVar116 * ZEXT816(0x472),0);
  auVar10 = auVar55 * auVar166 +
            auVar40 * auVar152 + auVar33 * auVar146 + auVar18 * auVar131 + auVar26 * auVar139 +
            auVar45 * auVar157 + auVar50 * auVar161 + auVar53 * auVar164;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = auVar10._0_8_;
  auVar229._8_8_ = SUB168(auVar117 * ZEXT816(0x239),8) + auVar10._8_8_ * 0x239;
  auVar229._0_8_ = SUB168(auVar117 * ZEXT816(0x239),0);
  auVar230 = auVar111 * auVar222 + auVar102 * auVar213 + auVar229 + auVar230;
  uVar249 = auVar230._0_8_;
  uVar255 = auVar230._8_8_;
  auVar232._8_8_ = uVar255 >> 0x33;
  auVar232._0_8_ = uVar255 * 0x2000 | uVar249 >> 0x33;
  auVar10 = auVar44 * auVar156 +
            auVar49 * auVar160 + auVar32 * auVar145 + auVar25 * auVar138 + auVar17 * auVar130 +
            auVar52 * auVar163;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar10._0_8_;
  auVar231._8_8_ = SUB168(auVar118 * ZEXT816(0x239),8) + auVar10._8_8_ * 0x239;
  auVar231._0_8_ = SUB168(auVar118 * ZEXT816(0x239),0);
  auVar232 = auVar110 * auVar221 + auVar93 * auVar204 + auVar101 * auVar212 + auVar244 + auVar231 +
             auVar232;
  uVar253 = auVar232._0_8_;
  uVar255 = auVar232._8_8_;
  auVar234._8_8_ = uVar255 >> 0x33;
  auVar234._0_8_ = uVar255 * 0x2000 | uVar253 >> 0x33;
  auVar10 = auVar48 * auVar159 + auVar43 * auVar155 + auVar24 * auVar137 + auVar16 * auVar129;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar10._0_8_;
  auVar245._8_8_ = SUB168(auVar119 * ZEXT816(0x239),8) + auVar10._8_8_ * 0x239;
  auVar245._0_8_ = SUB168(auVar119 * ZEXT816(0x239),0);
  auVar10 = auVar37 * auVar150 + auVar31 * auVar144;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar10._0_8_;
  auVar233._8_8_ = auVar10._8_8_ * 0x472 + SUB168(auVar120 * ZEXT816(0x472),8);
  auVar233._0_8_ = SUB168(auVar120 * ZEXT816(0x472),0);
  auVar234 = auVar109 * auVar220 +
             auVar85 * auVar196 + auVar100 * auVar211 + auVar92 * auVar203 + auVar233 + auVar245 +
             auVar234;
  uVar250 = auVar234._0_8_;
  uVar255 = auVar234._8_8_;
  auVar236._8_8_ = uVar255 >> 0x33;
  auVar236._0_8_ = uVar255 * 0x2000 | uVar250 >> 0x33;
  auVar10 = auVar36 * auVar149 + auVar30 * auVar143 + auVar23 * auVar136;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar10._0_8_;
  auVar235._8_8_ = SUB168(auVar121 * ZEXT816(0x472),8) + auVar10._8_8_ * 0x472;
  auVar235._0_8_ = SUB168(auVar121 * ZEXT816(0x472),0);
  auVar10 = auVar42 * auVar154 + auVar15 * auVar128;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = auVar10._0_8_;
  auVar226._8_8_ = auVar10._8_8_ * 0x239 + SUB168(auVar122 * ZEXT816(0x239),8);
  auVar226._0_8_ = SUB168(auVar122 * ZEXT816(0x239),0);
  auVar236 = auVar108 * auVar219 +
             auVar99 * auVar210 + auVar84 * auVar195 + auVar226 + auVar91 * auVar202 + auVar235 +
             auVar78 * auVar189 + auVar236;
  uVar248 = auVar236._0_8_;
  uVar255 = auVar236._8_8_;
  auVar238._8_8_ = uVar255 >> 0x33;
  auVar238._0_8_ = uVar255 * 0x2000 | uVar248 >> 0x33;
  auVar238 = auVar107 * auVar218 +
             auVar72 * auVar183 +
             auVar90 * auVar201 + auVar83 * auVar194 + auVar77 * auVar188 + auVar237 +
             auVar98 * auVar209 + auVar238;
  uVar256 = auVar238._0_8_;
  uVar255 = auVar238._8_8_;
  auVar239._8_8_ = uVar255 >> 0x34;
  auVar239._0_8_ = uVar255 * 0x1000 | uVar256 >> 0x34;
  auVar239 = auVar106 * auVar217 +
             auVar97 * auVar208 +
             auVar89 * auVar200 +
             auVar82 * auVar193 + auVar76 * auVar187 + auVar71 * auVar182 + auVar225 +
             auVar67 * auVar178 + auVar239;
  uVar247 = auVar239._0_8_;
  uVar255 = auVar239._8_8_;
  auVar241._8_8_ = uVar255 >> 0x33;
  auVar241._0_8_ = uVar255 * 0x2000 | uVar247 >> 0x33;
  auVar241 = auVar63 * auVar174 +
             auVar96 * auVar207 +
             auVar88 * auVar199 +
             auVar81 * auVar192 +
             auVar70 * auVar181 + auVar66 * auVar177 + auVar240 + auVar75 * auVar186 +
             auVar105 * auVar216 + auVar241;
  uVar252 = auVar241._0_8_;
  uVar255 = auVar241._8_8_;
  auVar242._8_8_ = uVar255 >> 0x33;
  auVar242._0_8_ = uVar255 * 0x2000 | uVar252 >> 0x33;
  auVar242 = auVar60 * auVar171 +
             auVar95 * auVar206 +
             auVar87 * auVar198 +
             auVar80 * auVar191 +
             auVar74 * auVar185 +
             auVar69 * auVar180 + auVar65 * auVar176 + auVar62 * auVar173 + auVar246 +
             auVar104 * auVar215 + auVar242;
  uVar254 = auVar242._0_8_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = auVar242._8_8_ * 0x2000 | uVar254 >> 0x33;
  auVar243 = auVar58 * auVar169 +
             auVar94 * auVar205 +
             auVar86 * auVar197 +
             auVar79 * auVar190 +
             auVar68 * auVar179 + auVar64 * auVar175 + auVar61 * auVar172 + auVar59 * auVar170 +
             auVar73 * auVar184 + auVar103 * auVar214 + auVar243;
  uVar255 = auVar243._0_8_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = auVar243._8_8_ * 0x2000 | uVar255 >> 0x33;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar251 & 0xfffffffffffff;
  auVar224 = auVar123 * ZEXT816(0x239) + auVar224;
  uVar251 = auVar224._0_8_;
  uVar249 = (auVar224._8_8_ << 0xc | uVar251 >> 0x34) + (uVar249 & 0x7ffffffffffff);
  *out1 = uVar251 & 0xfffffffffffff;
  out1[1] = uVar249 & 0x7ffffffffffff;
  out1[2] = (uVar249 >> 0x33) + (uVar253 & 0x7ffffffffffff);
  out1[3] = uVar250 & 0x7ffffffffffff;
  out1[4] = uVar248 & 0x7ffffffffffff;
  out1[5] = uVar256 & 0xfffffffffffff;
  out1[6] = uVar247 & 0x7ffffffffffff;
  out1[7] = uVar252 & 0x7ffffffffffff;
  out1[8] = uVar254 & 0x7ffffffffffff;
  out1[9] = uVar255 & 0x7ffffffffffff;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(
    uint64_t out1[10], const uint64_t arg1[10], const uint64_t arg2[10]) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x1;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x2;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x3;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x4;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x5;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x6;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x7;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x8;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x9;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x10;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x12;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x14;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x15;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x16;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x17;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x18;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x19;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x20;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x22;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x23;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x24;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x26;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x28;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x29;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x30;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x31;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x32;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x33;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x34;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x35;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x36;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x37;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x38;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x39;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x40;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x41;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x43;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x44;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x45;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x46;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x47;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x48;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x49;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x50;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x51;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x52;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x53;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x54;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x55;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x56;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x57;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x58;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x59;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x60;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x61;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x62;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x63;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x64;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x65;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x66;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x67;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x68;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x69;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x70;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x71;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x72;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x73;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x74;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x75;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x76;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x77;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x78;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x79;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x80;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x81;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x82;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x83;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x84;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x85;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x86;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x87;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x88;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x89;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x90;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x91;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x92;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x93;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x94;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x95;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x96;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x97;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x98;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x99;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x100;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x101;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x102;
    uint64_t x103;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x104;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x105;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x106;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x107;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x108;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x109;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x110;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x111;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x112;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x113;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x114;
    uint64_t x115;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x116;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x117;
    uint64_t x118;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x119;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x120;
    uint64_t x121;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x122;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x123;
    uint64_t x124;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x125;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x126;
    uint64_t x127;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x128;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x129;
    uint64_t x130;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x131;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x132;
    uint64_t x133;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x134;
    uint64_t x135;
    uint64_t x136;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x137;
    uint64_t x138;
    uint64_t x139;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x140;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x141;
    uint64_t x142;
    uint64_t x143;
    uint64_t x144;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x145;
    uint64_t x146;
    uint64_t x147;
    x1 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[9])));
    x2 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[8])));
    x3 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[7])));
    x4 = (UINT16_C(0x239) *
          (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
            (arg2[6])) *
           0x2));
    x5 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[5])));
    x6 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[4])));
    x7 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[3])));
    x8 = (UINT16_C(0x239) *
          ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[2])));
    x9 = (UINT16_C(0x239) *
          (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
            (arg2[1])) *
           0x2));
    x10 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
            (arg2[9])));
    x11 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
            (arg2[8])));
    x12 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
             (arg2[7])) *
            0x2));
    x13 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
             (arg2[6])) *
            0x2));
    x14 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
            (arg2[5])));
    x15 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
            (arg2[4])));
    x16 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
            (arg2[3])));
    x17 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
             (arg2[2])) *
            0x2));
    x18 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
            (arg2[9])));
    x19 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
             (arg2[8])) *
            0x2));
    x20 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
             (arg2[7])) *
            0x2));
    x21 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
             (arg2[6])) *
            0x2));
    x22 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
            (arg2[5])));
    x23 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
            (arg2[4])));
    x24 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
             (arg2[3])) *
            0x2));
    x25 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
             (arg2[9])) *
            0x2));
    x26 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
             (arg2[8])) *
            0x2));
    x27 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
             (arg2[7])) *
            0x2));
    x28 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
             (arg2[6])) *
            0x2));
    x29 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
            (arg2[5])));
    x30 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
             (arg2[4])) *
            0x2));
    x31 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
            (arg2[9])));
    x32 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
            (arg2[8])));
    x33 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
            (arg2[7])));
    x34 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
            (arg2[6])));
    x35 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
            (arg2[5])));
    x36 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
            (arg2[9])));
    x37 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
            (arg2[8])));
    x38 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
            (arg2[7])));
    x39 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
             (arg2[6])) *
            0x2));
    x40 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
            (arg2[9])));
    x41 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
            (arg2[8])));
    x42 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
             (arg2[7])) *
            0x2));
    x43 = (UINT16_C(0x239) *
           ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
            (arg2[9])));
    x44 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
             (arg2[8])) *
            0x2));
    x45 = (UINT16_C(0x239) *
           (((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
             (arg2[9])) *
            0x2));
    x46 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) *
           (arg2[0]));
    x47 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
           ((arg2[1]) * 0x2));
    x48 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) *
           (arg2[0]));
    x49 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
           ((arg2[2]) * 0x2));
    x50 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
           ((arg2[1]) * 0x2));
    x51 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
           (arg2[0]));
    x52 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           ((arg2[3]) * 0x2));
    x53 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           ((arg2[2]) * 0x2));
    x54 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           ((arg2[1]) * 0x2));
    x55 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           (arg2[0]));
    x56 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
           (arg2[4]));
    x57 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
           (arg2[3]));
    x58 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
           (arg2[2]));
    x59 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
           (arg2[1]));
    x60 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) *
           (arg2[0]));
    x61 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg2[5]));
    x62 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg2[4]));
    x63 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg2[3]));
    x64 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg2[2]));
    x65 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           ((arg2[1]) * 0x2));
    x66 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg2[0]));
    x67 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           ((arg2[6]) * 0x2));
    x68 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (arg2[5]));
    x69 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (arg2[4]));
    x70 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (arg2[3]));
    x71 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           ((arg2[2]) * 0x2));
    x72 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           ((arg2[1]) * 0x2));
    x73 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (arg2[0]));
    x74 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg2[7]) * 0x2));
    x75 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg2[6]) * 0x2));
    x76 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (arg2[5]));
    x77 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (arg2[4]));
    x78 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg2[3]) * 0x2));
    x79 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg2[2]) * 0x2));
    x80 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg2[1]) * 0x2));
    x81 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (arg2[0]));
    x82 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[8]) * 0x2));
    x83 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[7]) * 0x2));
    x84 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[6]) * 0x2));
    x85 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (arg2[5]));
    x86 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[4]) * 0x2));
    x87 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[3]) * 0x2));
    x88 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[2]) * 0x2));
    x89 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg2[1]) * 0x2));
    x90 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (arg2[0]));
    x91 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[9]));
    x92 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[8]));
    x93 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[7]));
    x94 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[6]));
    x95 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[5]));
    x96 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[4]));
    x97 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[3]));
    x98 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[2]));
    x99 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg2[1]));
    x100 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
            (arg2[0]));
    x101 = (x100 +
            (x45 + (x44 + (x42 + (x39 + (x35 + (x30 + (x24 + (x17 + x9)))))))));
    x102 = (x101 >> 52);
    x103 = (uint64_t)(x101 & UINT64_C(0xfffffffffffff));
    x104 =
        (x91 +
         (x82 + (x74 + (x67 + (x61 + (x56 + (x52 + (x49 + (x47 + x46)))))))));
    x105 = (x92 +
            (x83 + (x75 + (x68 + (x62 + (x57 + (x53 + (x50 + (x48 + x1)))))))));
    x106 = (x93 +
            (x84 + (x76 + (x69 + (x63 + (x58 + (x54 + (x51 + (x10 + x2)))))))));
    x107 = (x94 +
            (x85 + (x77 + (x70 + (x64 + (x59 + (x55 + (x18 + (x11 + x3)))))))));
    x108 = (x95 +
            (x86 + (x78 + (x71 + (x65 + (x60 + (x25 + (x19 + (x12 + x4)))))))));
    x109 = (x96 +
            (x87 + (x79 + (x72 + (x66 + (x31 + (x26 + (x20 + (x13 + x5)))))))));
    x110 = (x97 +
            (x88 + (x80 + (x73 + (x36 + (x32 + (x27 + (x21 + (x14 + x6)))))))));
    x111 = (x98 +
            (x89 + (x81 + (x40 + (x37 + (x33 + (x28 + (x22 + (x15 + x7)))))))));
    x112 = (x99 +
            (x90 + (x43 + (x41 + (x38 + (x34 + (x29 + (x23 + (x16 + x8)))))))));
    x113 = (x102 + x112);
    x114 = (x113 >> 51);
    x115 = (uint64_t)(x113 & UINT64_C(0x7ffffffffffff));
    x116 = (x114 + x111);
    x117 = (x116 >> 51);
    x118 = (uint64_t)(x116 & UINT64_C(0x7ffffffffffff));
    x119 = (x117 + x110);
    x120 = (x119 >> 51);
    x121 = (uint64_t)(x119 & UINT64_C(0x7ffffffffffff));
    x122 = (x120 + x109);
    x123 = (x122 >> 51);
    x124 = (uint64_t)(x122 & UINT64_C(0x7ffffffffffff));
    x125 = (x123 + x108);
    x126 = (x125 >> 52);
    x127 = (uint64_t)(x125 & UINT64_C(0xfffffffffffff));
    x128 = (x126 + x107);
    x129 = (x128 >> 51);
    x130 = (uint64_t)(x128 & UINT64_C(0x7ffffffffffff));
    x131 = (x129 + x106);
    x132 = (x131 >> 51);
    x133 = (uint64_t)(x131 & UINT64_C(0x7ffffffffffff));
    x134 = (x132 + x105);
    x135 = (uint64_t)(x134 >> 51);
    x136 = (uint64_t)(x134 & UINT64_C(0x7ffffffffffff));
    x137 = (x135 + x104);
    x138 = (uint64_t)(x137 >> 51);
    x139 = (uint64_t)(x137 & UINT64_C(0x7ffffffffffff));
    x140 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)UINT16_C(0x239) *
            x138);
    x141 = (x103 + x140);
    x142 = (uint64_t)(x141 >> 52);
    x143 = (uint64_t)(x141 & UINT64_C(0xfffffffffffff));
    x144 = (x142 + x115);
    x145 = (fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1)(x144 >> 51);
    x146 = (x144 & UINT64_C(0x7ffffffffffff));
    x147 = (x145 + x118);
    out1[0] = x143;
    out1[1] = x146;
    out1[2] = x147;
    out1[3] = x121;
    out1[4] = x124;
    out1[5] = x127;
    out1[6] = x130;
    out1[7] = x133;
    out1[8] = x136;
    out1[9] = x139;
}